

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_standard_types.cpp
# Opt level: O2

void __thiscall MapWriter_write_Test::~MapWriter_write_Test(MapWriter_write_Test *this)

{
  anon_unknown.dwarf_28a10::MapWriter::~MapWriter(&this->super_MapWriter);
  operator_delete(this,0x48);
  return;
}

Assistant:

TEST_F (MapWriter, write) {
    std::vector<std::uint8_t> expected_bytes;
    pstore::serialize::archive::vector_writer expected{expected_bytes};

    pstore::serialize::write (expected, std::size_t{2});
    pstore::serialize::write (expected, "k1"s);
    pstore::serialize::write (expected, "First key"s);
    pstore::serialize::write (expected, "k2"s);
    pstore::serialize::write (expected, "Second key"s);

    auto const num_expected_bytes = std::distance (std::begin (expected), std::end (expected));
    auto const num_actual_bytes = std::distance (std::begin (writer_), std::end (writer_));
    ASSERT_EQ (num_expected_bytes, num_actual_bytes);

    EXPECT_TRUE (std::equal (std::begin (expected), std::end (expected), std::begin (writer_)));
}